

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O1

class_<ki::dml::Record> * __thiscall
pybind11::class_<ki::dml::Record>::
def<ki::dml::Field<unsigned_short>*(ki::dml::Record::*)(std::__cxx11::string,bool),pybind11::arg,pybind11::arg_v,pybind11::return_value_policy>
          (class_<ki::dml::Record> *this,char *name_,offset_in_Field<signed_char>_to_subr *f,
          arg *extra,arg_v *extra_1,return_value_policy *extra_2)

{
  offset_in_Field<signed_char>_to_subr f_00;
  name *extra_00;
  handle local_80;
  undefined1 local_78 [8];
  cpp_function cf;
  handle local_68;
  object local_60;
  arg_v *local_58;
  is_method local_50;
  handle local_48;
  handle local_40;
  object local_38;
  
  f_00 = *f;
  extra_00 = (name *)f[1];
  local_68.m_ptr = (this->super_generic_type).super_object.super_handle.m_ptr;
  local_60.super_handle.m_ptr = (handle)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  local_58 = (arg_v *)extra;
  local_50.class_.m_ptr = (handle)(handle)name_;
  local_80.m_ptr = (PyObject *)PyObject_GetAttrString();
  if (local_80.m_ptr == (PyObject *)0x0) {
    PyErr_Clear();
    local_80.m_ptr = (PyObject *)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
  }
  local_78 = (undefined1  [8])local_80.m_ptr;
  cpp_function::
  cpp_function<ki::dml::Field<unsigned_short>*,ki::dml::Record,std::__cxx11::string,bool,pybind11::name,pybind11::is_method,pybind11::sibling,pybind11::arg,pybind11::arg_v,pybind11::return_value_policy>
            (&cf,f_00,extra_00,&local_50,(sibling *)&local_68,(arg *)local_78,local_58,
             (return_value_policy *)extra_1);
  object::~object((object *)&local_80);
  object::~object(&local_60);
  cpp_function::name((cpp_function *)local_78);
  local_48.m_ptr = (this->super_generic_type).super_object.super_handle.m_ptr;
  if ((object)local_78 != (PyObject *)0x0) {
    *(long *)local_78 = *(long *)local_78 + 1;
  }
  local_40.m_ptr = (PyObject *)local_78;
  local_68.m_ptr = (PyObject *)0x0;
  local_38.super_handle.m_ptr = (handle)(PyObject *)0x0;
  object::~object((object *)&local_68);
  detail::accessor_policies::obj_attr::set
            (local_48,local_40,(handle)cf.super_function.super_object.super_handle.m_ptr);
  object::~object(&local_38);
  object::~object((object *)&local_40);
  object::~object((object *)local_78);
  object::~object((object *)&cf);
  return this;
}

Assistant:

class_ &def(const char *name_, Func&& f, const Extra&... extra) {
        cpp_function cf(method_adaptor<type>(std::forward<Func>(f)), name(name_), is_method(*this),
                        sibling(getattr(*this, name_, none())), extra...);
        attr(cf.name()) = cf;
        return *this;
    }